

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool __thiscall
cmListCommand::GetList
          (cmListCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *list,string *var)

{
  cmMakefile *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  ulong uVar3;
  PolicyID id;
  PolicyID id_00;
  string local_d8;
  undefined1 local_b8 [8];
  string warn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  undefined4 local_58;
  undefined1 local_48 [8];
  string listString;
  string *var_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *list_local;
  cmListCommand *this_local;
  
  listString.field_2._8_8_ = var;
  std::__cxx11::string::string((string *)local_48);
  bVar1 = GetListString(this,(string *)local_48,(string *)listString.field_2._8_8_);
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cmSystemTools::ExpandListArgument((string *)local_48,list,true);
      local_68._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(list);
      local_70._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(list);
      std::__cxx11::string::string((string *)&local_90);
      local_60 = std::
                 find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                           (local_68,local_70,&local_90);
      warn.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(list);
      bVar1 = __gnu_cxx::operator==
                        (&local_60,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&warn.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_90);
      if (bVar1) {
        this_local._7_1_ = true;
        local_58 = 1;
      }
      else {
        PVar2 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0007,false);
        switch(PVar2) {
        case OLD:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(list);
          cmSystemTools::ExpandListArgument((string *)local_48,list,false);
          this_local._7_1_ = true;
          local_58 = 1;
          break;
        case WARN:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(list);
          cmSystemTools::ExpandListArgument((string *)local_48,list,false);
          cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_b8,(cmPolicies *)0x7,id_00);
          std::__cxx11::string::operator+=((string *)local_b8," List has value = [");
          std::__cxx11::string::operator+=((string *)local_b8,(string *)local_48);
          std::__cxx11::string::operator+=((string *)local_b8,"].");
          cmMakefile::IssueMessage
                    ((this->super_cmCommand).Makefile,AUTHOR_WARNING,(string *)local_b8);
          this_local._7_1_ = true;
          local_58 = 1;
          std::__cxx11::string::~string((string *)local_b8);
          break;
        case NEW:
          this_local._7_1_ = true;
          local_58 = 1;
          break;
        case REQUIRED_IF_USED:
        case REQUIRED_ALWAYS:
          this_00 = (this->super_cmCommand).Makefile;
          cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_d8,(cmPolicies *)0x7,id);
          cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
          this_local._7_1_ = false;
          local_58 = 1;
          break;
        default:
          this_local._7_1_ = true;
          local_58 = 1;
        }
      }
    }
    else {
      this_local._7_1_ = true;
      local_58 = 1;
    }
  }
  else {
    this_local._7_1_ = false;
    local_58 = 1;
  }
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool cmListCommand::GetList(std::vector<std::string>& list,
                            const std::string& var)
{
  std::string listString;
  if (!this->GetListString(listString, var)) {
    return false;
  }
  // if the size of the list
  if (listString.empty()) {
    return true;
  }
  // expand the variable into a list
  cmSystemTools::ExpandListArgument(listString, list, true);
  // if no empty elements then just return
  if (std::find(list.begin(), list.end(), std::string()) == list.end()) {
    return true;
  }
  // if we have empty elements we need to check policy CMP0007
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0007)) {
    case cmPolicies::WARN: {
      // Default is to warn and use old behavior
      // OLD behavior is to allow compatibility, so recall
      // ExpandListArgument without the true which will remove
      // empty values
      list.clear();
      cmSystemTools::ExpandListArgument(listString, list);
      std::string warn = cmPolicies::GetPolicyWarning(cmPolicies::CMP0007);
      warn += " List has value = [";
      warn += listString;
      warn += "].";
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, warn);
      return true;
    }
    case cmPolicies::OLD:
      // OLD behavior is to allow compatibility, so recall
      // ExpandListArgument without the true which will remove
      // empty values
      list.clear();
      cmSystemTools::ExpandListArgument(listString, list);
      return true;
    case cmPolicies::NEW:
      return true;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0007));
      return false;
  }
  return true;
}